

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O3

bool Js::TypedArrayCompareElementsHelper<double>(CompareVarsInfo *cvInfo,void *elem1,void *elem2)

{
  double value;
  RecyclableObject *this;
  ScriptContext *scriptContext;
  RecyclableObject *pRVar1;
  ThreadContext *this_00;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  JavascriptMethod p_Var5;
  Var pvVar6;
  Var pvVar7;
  double dVar8;
  bool bVar9;
  
  if (elem1 == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x865,"(element1 != nullptr)","element1 != nullptr");
    if (!bVar3) goto LAB_00d7ba52;
    *puVar4 = 0;
  }
  if (elem2 == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x866,"(element2 != nullptr)","element2 != nullptr");
    if (!bVar3) goto LAB_00d7ba52;
    *puVar4 = 0;
  }
  if (cvInfo == (CompareVarsInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x867,"(cvInfo != nullptr)","cvInfo != nullptr");
    if (!bVar3) goto LAB_00d7ba52;
    *puVar4 = 0;
  }
  dVar8 = *elem1;
  value = *elem2;
  bVar3 = NumberUtilities::IsNan(dVar8);
  if (bVar3) {
    return false;
  }
  bVar3 = NumberUtilities::IsNan(value);
  if (bVar3) {
    return true;
  }
  this = (cvInfo->compFn).ptr;
  if (this == (RecyclableObject *)0x0) {
    bVar3 = value == dVar8;
    bVar9 = value < dVar8;
LAB_00d7ba3c:
    bVar3 = !bVar9 && !bVar3;
  }
  else {
    scriptContext =
         (((((this->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
         ptr;
    pRVar1 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
    this_00 = scriptContext->threadContext;
    bVar3 = this_00->reentrancySafeOrHandled;
    this_00->reentrancySafeOrHandled = true;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    if (scriptContext->threadContext->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var5 = RecyclableObject::GetEntryPoint(this);
    CheckIsExecutable(this,p_Var5);
    p_Var5 = RecyclableObject::GetEntryPoint(this);
    pvVar6 = JavascriptNumber::ToVarNoCheck(dVar8,scriptContext);
    pvVar7 = JavascriptNumber::ToVarNoCheck(value,scriptContext);
    pvVar6 = (*p_Var5)(this,(CallInfo)this,0x2000003,0,0,0,0,0x2000003,pRVar1,pvVar6,pvVar7);
    this_00->reentrancySafeOrHandled = bVar3;
    if (((ulong)pvVar6 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)pvVar6 & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)pvVar6 & 0xffff000000000000) != 0x1000000000000) {
        if ((ulong)pvVar6 >> 0x32 == 0) {
          dVar8 = JavascriptConversion::ToNumber_Full(pvVar6,scriptContext);
        }
        else {
          dVar8 = (double)((ulong)pvVar6 ^ 0xfffc000000000000);
        }
        bVar3 = dVar8 == 0.0;
        bVar9 = 0.0 < dVar8;
        goto LAB_00d7ba3c;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00d7ba52;
      *puVar4 = 0;
    }
    if (((ulong)pvVar6 & 0x1ffff00000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) {
LAB_00d7ba52:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    bVar3 = (bool)((byte)((ulong)pvVar6 >> 0x1f) & 1);
  }
  return bVar3;
}

Assistant:

bool TypedArrayCompareElementsHelper(JavascriptArray::CompareVarsInfo* cvInfo, const void* elem1, const void* elem2)
    {
        const T* element1 = static_cast<const T*>(elem1);
        const T* element2 = static_cast<const T*>(elem2);

        Assert(element1 != nullptr);
        Assert(element2 != nullptr);
        Assert(cvInfo != nullptr);

        const T x = *element1;
        const T y = *element2;

        // ECMA2023 spec requires that NaN values are sorted to the end
        if (NumberUtilities::IsNan((double)x))
        {
            return false;
        }
        else if (NumberUtilities::IsNan((double)y))
        {
            return true;
        }

        if (cvInfo->compFn != nullptr)
        {
            RecyclableObject* compFn = cvInfo->compFn;
            ScriptContext* scriptContext = compFn->GetScriptContext();
            Var undefined = scriptContext->GetLibrary()->GetUndefined();
            Var retVal = nullptr;
            BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
            {
                retVal = CALL_FUNCTION(scriptContext->GetThreadContext(),
                            compFn, CallInfo(CallFlags_Value, 3),
                            undefined,
                            JavascriptNumber::ToVarNoCheck((double)x, scriptContext),
                            JavascriptNumber::ToVarNoCheck((double)y, scriptContext));
            }
            END_SAFE_REENTRANT_CALL

            if (TaggedInt::Is(retVal))
            {
                return TaggedInt::ToInt32(retVal) < 0;
            }

            if (JavascriptNumber::Is_NoTaggedIntCheck(retVal))
            {
                return JavascriptNumber::GetValue(retVal) < 0;
            }

            return JavascriptConversion::ToNumber_Full(retVal, scriptContext) < 0;
        }
        else // simple comparison when no user method provided
        {
            return x < y;
        }
    }